

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O1

uint8_t * __thiscall
google::protobuf::io::EpsCopyOutputStream::WriteString
          (EpsCopyOutputStream *this,uint32_t num,Cord *s,uint8_t *ptr)

{
  ulong uVar1;
  uint8_t *puVar2;
  uint8_t *extraout_RAX;
  uint uVar3;
  
  if (this->end_ <= ptr) {
    ptr = EnsureSpaceFallback(this,ptr);
  }
  if (this->end_ <= ptr) {
    WriteString((EpsCopyOutputStream *)&stack0xffffffffffffffd8);
    return extraout_RAX;
  }
  uVar1 = (ulong)(num * 8 + 2);
  if (0x7f < num << 3) {
    do {
      uVar3 = (uint)uVar1;
      *ptr = (byte)uVar1 | 0x80;
      uVar1 = uVar1 >> 7;
      ptr = ptr + 1;
    } while (0x3fff < uVar3);
  }
  *ptr = (byte)uVar1;
  puVar2 = WriteCordOutline(this,s,ptr + 1);
  return puVar2;
}

Assistant:

uint8_t* WriteString(uint32_t num, const absl::Cord& s, uint8_t* ptr) {
    ptr = EnsureSpace(ptr);
    ptr = WriteTag(num, 2, ptr);
    return WriteCordOutline(s, ptr);
  }